

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common-test.c++
# Opt level: O0

void __thiscall kj::anon_unknown_0::TestCase389::run(TestCase389 *this)

{
  Deferred<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_common_test_c__:395:5)>
  DVar1;
  bool local_8d;
  uint local_8c;
  bool _kj_shouldLog_5;
  uint local_84;
  bool local_7e;
  bool _kj_shouldLog_4;
  uint local_7c;
  bool _kj_shouldLog_3;
  bool _kj_shouldLog_2;
  uint local_74;
  bool _kj_shouldLog_1;
  bool _kj_shouldLog;
  uint *local_60;
  undefined1 *local_58;
  undefined1 local_50 [8];
  Deferred<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_common_test_c__:396:5)>
  _kjDefer396;
  undefined1 local_30 [8];
  Deferred<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_common_test_c__:395:5)>
  _kjDefer395;
  uint local_18;
  uint uStack_14;
  bool k;
  uint j;
  uint i;
  TestCase389 *this_local;
  
  uStack_14 = 0;
  local_18 = 1;
  _kjDefer395._15_1_ = 0;
  _kjDefer396._16_8_ = &stack0xffffffffffffffec;
  _j = this;
  DVar1 = defer<kj::(anonymous_namespace)::TestCase389::run()::__0>
                    ((kj *)local_30,(Type *)&_kjDefer396.canceled);
  local_60 = &local_18;
  local_58 = &_kjDefer395.field_0xf;
  defer<kj::(anonymous_namespace)::TestCase389::run()::__1>
            ((Deferred<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_common_test_c__:396:5)>
              *)local_50,(kj *)&local_60,DVar1._8_8_);
  if (uStack_14 != 0) {
    _kj_shouldLog_1 = _::Debug::shouldLog(ERROR);
    while (_kj_shouldLog_1 != false) {
      local_74 = 0;
      _::Debug::log<char_const(&)[29],unsigned_int,unsigned_int&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/common-test.c++"
                 ,0x18d,ERROR,"\"failed: expected \" \"(0u) == (i)\", 0u, i",
                 (char (*) [29])"failed: expected (0u) == (i)",&local_74,&stack0xffffffffffffffec);
      _kj_shouldLog_1 = false;
    }
  }
  if (local_18 != 1) {
    _kj_shouldLog_2 = _::Debug::shouldLog(ERROR);
    while (_kj_shouldLog_2 != false) {
      local_7c = 1;
      _::Debug::log<char_const(&)[29],unsigned_int,unsigned_int&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/common-test.c++"
                 ,0x18e,ERROR,"\"failed: expected \" \"(1u) == (j)\", 1u, j",
                 (char (*) [29])"failed: expected (1u) == (j)",&local_7c,&local_18);
      _kj_shouldLog_2 = false;
    }
  }
  if ((_kjDefer395._15_1_ & 1) != 0) {
    _kj_shouldLog_4 = _::Debug::shouldLog(ERROR);
    while (_kj_shouldLog_4 != false) {
      _::Debug::log<char_const(&)[22]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/common-test.c++"
                 ,399,ERROR,"\"failed: expected \" \"!(k)\"",(char (*) [22])"failed: expected !(k)")
      ;
      _kj_shouldLog_4 = false;
    }
  }
  _::
  Deferred<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/common-test.c++:396:5)>
  ::~Deferred((Deferred<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_common_test_c__:396:5)>
               *)local_50);
  _::
  Deferred<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/common-test.c++:395:5)>
  ::~Deferred((Deferred<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_common_test_c__:395:5)>
               *)local_30);
  if (uStack_14 != 1) {
    local_7e = _::Debug::shouldLog(ERROR);
    while (local_7e != false) {
      local_84 = 1;
      _::Debug::log<char_const(&)[29],unsigned_int,unsigned_int&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/common-test.c++"
                 ,0x192,ERROR,"\"failed: expected \" \"(1u) == (i)\", 1u, i",
                 (char (*) [29])"failed: expected (1u) == (i)",&local_84,&stack0xffffffffffffffec);
      local_7e = false;
    }
  }
  if (local_18 != 4) {
    _kj_shouldLog_5 = _::Debug::shouldLog(ERROR);
    while (_kj_shouldLog_5 != false) {
      local_8c = 4;
      _::Debug::log<char_const(&)[29],unsigned_int,unsigned_int&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/common-test.c++"
                 ,0x193,ERROR,"\"failed: expected \" \"(4u) == (j)\", 4u, j",
                 (char (*) [29])"failed: expected (4u) == (j)",&local_8c,&local_18);
      _kj_shouldLog_5 = false;
    }
  }
  if ((_kjDefer395._15_1_ & 1) == 0) {
    local_8d = _::Debug::shouldLog(ERROR);
    while (local_8d != false) {
      _::Debug::log<char_const(&)[19]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/common-test.c++"
                 ,0x194,ERROR,"\"failed: expected \" \"k\"",(char (*) [19])"failed: expected k");
      local_8d = false;
    }
  }
  return;
}

Assistant:

TEST(Common, Defer) {
  uint i = 0;
  uint j = 1;
  bool k = false;

  {
    KJ_DEFER(++i);
    KJ_DEFER(j += 3; k = true);
    EXPECT_EQ(0u, i);
    EXPECT_EQ(1u, j);
    EXPECT_FALSE(k);
  }

  EXPECT_EQ(1u, i);
  EXPECT_EQ(4u, j);
  EXPECT_TRUE(k);
}